

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase::testGroupStarting(StreamingReporterBase *this,GroupInfo *_groupInfo)

{
  GroupInfo *_groupInfo_local;
  StreamingReporterBase *this_local;
  
  LazyStat<Catch::GroupInfo>::operator=(&this->currentGroupInfo,_groupInfo);
  return;
}

Assistant:

virtual void testGroupStarting( GroupInfo const& _groupInfo ) CATCH_OVERRIDE {
            currentGroupInfo = _groupInfo;
        }